

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_50a29::BinaryExpr::BinaryExpr(BinaryExpr *this,ExprPtr *l,ExprPtr *r)

{
  ExprPtr *r_local;
  ExprPtr *l_local;
  BinaryExpr *this_local;
  
  pegmatite::Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__BinaryExpr_0022ef98;
  pegmatite::ExprPtr::ExprPtr(&this->left,l);
  pegmatite::ExprPtr::ExprPtr(&this->right,r);
  return;
}

Assistant:

BinaryExpr(const ExprPtr &l, const ExprPtr &r) :
		left(l), right(r) { }